

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLoggerMgr::logStackBacktrace(SimpleLoggerMgr *this,size_t timeout_ms)

{
  pointer pRVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  time_point now;
  ostream *poVar7;
  RawStackInfo *entry;
  pointer pRVar8;
  ulong uVar9;
  TimeInfo lt;
  string path;
  char time_fmt [64];
  char filename [128];
  
  LOCK();
  (this->abortTimer).super___atomic_base<unsigned_long>._M_i = timeout_ms;
  UNLOCK();
  if ((this->crashDumpPath)._M_string_length != 0) {
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      TimeInfo::TimeInfo(&lt,now);
      uVar5 = getTzGap();
      uVar6 = -uVar5;
      if (0 < (int)uVar5) {
        uVar6 = uVar5;
      }
      uVar2 = (ulong)uVar6 / 0x3c;
      uVar3 = (ulong)uVar6 % 0x3c;
      uVar9 = (ulong)(((int)uVar5 >> 0x1f) * -2 + 0x2b);
      snprintf(filename,0x80,"dump_%04d%02d%02d_%02d%02d%02d%c%02d%02d.txt",(ulong)(uint)lt.year,
               (ulong)(uint)lt.month,(ulong)(uint)lt.day,(ulong)(uint)lt.hour,(ulong)(uint)lt.min,
               (ulong)(uint)lt.sec,uVar9,uVar2,uVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)time_fmt,
                     &this->crashDumpPath,"/");
      std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           time_fmt,filename);
      std::__cxx11::string::~string((string *)time_fmt);
      std::ofstream::open((string *)&this->crashDumpFile,(_Ios_Openmode)&path);
      snprintf(time_fmt,0x40,"%04d-%02d-%02dT%02d:%02d:%02d.%03d%03d%c%02d:%02d",
               (ulong)(uint)lt.year,(ulong)(uint)lt.month,(ulong)(uint)lt.day,(ulong)(uint)lt.hour,
               (ulong)(uint)lt.min,(ulong)(uint)lt.sec,(ulong)(uint)lt.msec,(ulong)(uint)lt.usec,
               uVar9,uVar2,uVar3);
      poVar7 = std::operator<<((ostream *)&this->crashDumpFile,"When: ");
      poVar7 = std::operator<<(poVar7,time_fmt);
      poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::string::~string((string *)&path);
    }
  }
  flushCriticalInfo(this);
  addRawStackInfo(this,true);
  logStackBackTraceOtherThreads(this);
  pRVar1 = (this->crashDumpThreadStacks).
           super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar8 = (this->crashDumpThreadStacks).
                super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar8 != pRVar1; pRVar8 = pRVar8 + 1) {
    flushRawStack(this,pRVar8);
  }
  pRVar1 = (this->crashDumpThreadStacks).
           super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar8 = (this->crashDumpThreadStacks).
                super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar8 != pRVar1; pRVar8 = pRVar8 + 1) {
    flushStackTraceBuffer(this,pRVar8);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::logStackBacktrace(size_t timeout_ms) {
    // Set abort timeout: 60 seconds.
    abortTimer = timeout_ms;

    if (!crashDumpPath.empty() && !crashDumpFile.is_open()) {
        // Open crash dump file.
        TimeInfo lt( std::chrono::system_clock::now() );
        int tz_gap = getTzGap();
        int tz_gap_abs = (tz_gap < 0) ? (tz_gap * -1) : (tz_gap);

        char filename[128];
        snprintf(filename, 128, "dump_%04d%02d%02d_%02d%02d%02d%c%02d%02d.txt",
                lt.year, lt.month, lt.day,
                lt.hour, lt.min, lt.sec,
                (tz_gap >= 0) ? '+' : '-',
                (int)(tz_gap_abs / 60), tz_gap_abs % 60);
        std::string path = crashDumpPath + "/" + filename;
        crashDumpFile.open(path);

        char time_fmt[64];
        snprintf(time_fmt, 64, "%04d-%02d-%02dT%02d:%02d:%02d.%03d%03d%c%02d:%02d",
                lt.year, lt.month, lt.day,
                lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
                (tz_gap >= 0) ? '+' : '-',
                (int)(tz_gap_abs / 60), tz_gap_abs % 60);
        crashDumpFile << "When: " << time_fmt << std::endl << std::endl;
    }

    flushCriticalInfo();
    addRawStackInfo(true);
    // Collect other threads' stack info.
    logStackBackTraceOtherThreads();

    // Now print out.
    // For the case where `addr2line` is hanging, flush raw pointer first.
    for (RawStackInfo& entry: crashDumpThreadStacks) {
        flushRawStack(entry);
    }
    for (RawStackInfo& entry: crashDumpThreadStacks) {
        flushStackTraceBuffer(entry);
    }
}